

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O2

int64_t __thiscall File::seek(File *this,int64_t offset,SeekMethod whence)

{
  __off64_t _Var1;
  uint __whence;
  int __fd;
  
  __fd = (int)this->m_impl;
  if (__fd == -1) {
    return -1;
  }
  __whence = (uint)(whence == smCurrent);
  if (whence == smEnd) {
    __whence = 2;
  }
  this->m_pos = offset;
  _Var1 = lseek64(__fd,offset,__whence);
  return _Var1;
}

Assistant:

int64_t File::seek(const int64_t offset, const SeekMethod whence) const
{
    if (!isOpen())
        return UINT64_C(-1);

    int sWhence = 0;
    switch (whence)
    {
    case SeekMethod::smBegin:
        sWhence = SEEK_SET;
        break;
    case SeekMethod::smCurrent:
        sWhence = SEEK_CUR;
        break;
    case SeekMethod::smEnd:
        sWhence = SEEK_END;
        break;
    }
    m_pos = offset;
    return lseek(to_fd(m_impl), offset, sWhence);
}